

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDDOMParser::endAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,bool complete)

{
  XMLBuffer *this_00;
  DOMDocumentImpl *pDVar1;
  DOMNode *pDVar2;
  int iVar3;
  XMLSize_t XVar4;
  XMLCh *pXVar5;
  XMLSize_t XVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  XMLSize_t XVar7;
  
  this_00 = &this->fAnnotationBuf;
  XVar6 = (this->fAnnotationBuf).fIndex;
  XVar4 = (this->fAnnotationBuf).fCapacity;
  if ((int)CONCAT71(in_register_00000011,complete) == 0) {
    if (XVar6 == XVar4) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar6 = (this->fAnnotationBuf).fIndex;
      XVar4 = (this->fAnnotationBuf).fCapacity;
    }
    pXVar5 = (this->fAnnotationBuf).fBuffer;
    XVar7 = XVar6 + 1;
    (this->fAnnotationBuf).fIndex = XVar7;
    pXVar5[XVar6] = L'<';
    if (XVar7 == XVar4) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar7 = (this->fAnnotationBuf).fIndex;
      pXVar5 = (this->fAnnotationBuf).fBuffer;
    }
    (this->fAnnotationBuf).fIndex = XVar7 + 1;
    pXVar5[XVar7] = L'/';
    pXVar5 = QName::getRawName(elemDecl->fElementName);
    XMLBuffer::append(this_00,pXVar5);
    XVar6 = (this->fAnnotationBuf).fIndex;
    if (XVar6 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar6 = this_00->fIndex;
    }
    (this->fAnnotationBuf).fIndex = XVar6 + 1;
    (this->fAnnotationBuf).fBuffer[XVar6] = L'>';
  }
  else {
    if (XVar6 == XVar4) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar6 = (this->fAnnotationBuf).fIndex;
      XVar4 = (this->fAnnotationBuf).fCapacity;
    }
    pXVar5 = (this->fAnnotationBuf).fBuffer;
    XVar7 = XVar6 + 1;
    (this->fAnnotationBuf).fIndex = XVar7;
    pXVar5[XVar6] = L'\n';
    if (XVar7 == XVar4) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar7 = (this->fAnnotationBuf).fIndex;
      XVar4 = (this->fAnnotationBuf).fCapacity;
      pXVar5 = (this->fAnnotationBuf).fBuffer;
    }
    XVar6 = XVar7 + 1;
    this_00->fIndex = XVar6;
    pXVar5[XVar7] = L'<';
    if (XVar6 == XVar4) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar6 = (this->fAnnotationBuf).fIndex;
      pXVar5 = (this->fAnnotationBuf).fBuffer;
    }
    (this->fAnnotationBuf).fIndex = XVar6 + 1;
    pXVar5[XVar6] = L'/';
    pXVar5 = QName::getRawName(elemDecl->fElementName);
    XMLBuffer::append(this_00,pXVar5);
    XVar6 = (this->fAnnotationBuf).fIndex;
    if (XVar6 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar6 = this_00->fIndex;
    }
    pXVar5 = (this->fAnnotationBuf).fBuffer;
    (this->fAnnotationBuf).fIndex = XVar6 + 1;
    pXVar5[XVar6] = L'>';
    pDVar1 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
    pXVar5[XVar6 + 1] = L'\0';
    iVar3 = (*(pDVar1->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3e])();
    pDVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode;
    (*pDVar2->_vptr_DOMNode[0x11])(pDVar2,CONCAT44(extraout_var,iVar3));
    (this->fAnnotationBuf).fIndex = 0;
  }
  return;
}

Assistant:

void XSDDOMParser::endAnnotationElement( const XMLElementDecl& elemDecl
                                       , bool complete)
{
    if (complete)
    {
        fAnnotationBuf.append(chLF);
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);

        // note that this is always called after endElement on <annotation>'s
        // child and before endElement on annotation.
        // hence, we must make this the child of the current
        // parent's only child.
        DOMTextImpl *node = (DOMTextImpl *)fDocument->createTextNode(fAnnotationBuf.getRawBuffer());
        fCurrentNode->appendChild(node);
        fAnnotationBuf.reset();
    }
    else      //capturing character calls
    {
        fAnnotationBuf.append(chOpenAngle);
        fAnnotationBuf.append(chForwardSlash);
        fAnnotationBuf.append(elemDecl.getFullName());
        fAnnotationBuf.append(chCloseAngle);
    }
}